

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbcDecrypt.c
# Opt level: O1

void decryptInPlace(ThreefishKey_t *key,uint64_t *chain,uint64_t *plain_text,uint64_t num_blocks)

{
  u64b_t uVar1;
  ulong *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *extraout_RDX;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint64_t *puVar13;
  bool bVar14;
  ulong uStack_110;
  ulong uStack_108;
  ulong uStack_100;
  ulong uStack_f8;
  ulong uStack_f0;
  ulong uStack_e8;
  ulong uStack_e0;
  ulong uStack_d8;
  ulong uStack_d0;
  ulong uStack_c8;
  ulong uStack_c0;
  ulong uStack_b8;
  ulong uStack_b0;
  ulong uStack_a8;
  ulong uStack_a0;
  ulong uStack_98;
  ulong uStack_90;
  ulong uStack_88;
  ulong uStack_80;
  ulong uStack_78;
  ulong uStack_70;
  ulong uStack_68;
  ulong uStack_60;
  ulong uStack_58;
  ulong uStack_50;
  
  uVar1 = key->stateSize;
  if (uVar1 == 0x400) {
    if (num_blocks << 4 != 0) {
      uVar4 = 0;
      uVar6 = 0;
      uVar7 = 0;
      uVar8 = 0;
      uVar9 = 0;
      uVar10 = 0;
      uVar11 = 0;
      uStack_50 = 0;
      uStack_58 = 0;
      uStack_60 = 0;
      uStack_68 = 0;
      uStack_70 = 0;
      uStack_78 = 0;
      uStack_80 = 0;
      uStack_88 = 0;
      uStack_90 = 0;
      uStack_98 = 0;
      uStack_a0 = 0;
      uVar12 = 0;
      uStack_a8 = 0;
      uStack_b0 = 0;
      uStack_b8 = 0;
      uStack_c0 = 0;
      uStack_c8 = 0;
      uStack_d0 = 0;
      uStack_d8 = 0;
      uStack_e0 = 0;
      uStack_e8 = 0;
      uStack_f0 = 0;
      uStack_f8 = 0;
      uStack_100 = 0;
      uStack_108 = 0;
      uStack_110 = 0;
      puVar13 = plain_text;
      do {
        bVar14 = (uVar6 & 0x10) == 0;
        uVar5 = plain_text[uVar6 + 1];
        if (bVar14) {
          uStack_98 = plain_text[uVar6 + 1];
          uVar5 = uStack_110;
        }
        uStack_110 = uVar5;
        uVar5 = plain_text[uVar6 + 2];
        if (bVar14) {
          uStack_90 = plain_text[uVar6 + 2];
          uVar5 = uStack_108;
        }
        uStack_108 = uVar5;
        uVar5 = plain_text[uVar6 + 3];
        if (bVar14) {
          uStack_88 = plain_text[uVar6 + 3];
          uVar5 = uStack_100;
        }
        uStack_100 = uVar5;
        uVar5 = plain_text[uVar6 + 4];
        if (bVar14) {
          uStack_80 = plain_text[uVar6 + 4];
          uVar5 = uStack_f8;
        }
        uStack_f8 = uVar5;
        uVar5 = plain_text[uVar6 + 5];
        if (bVar14) {
          uStack_78 = plain_text[uVar6 + 5];
          uVar5 = uStack_f0;
        }
        uStack_f0 = uVar5;
        uVar5 = plain_text[uVar6 + 6];
        if (bVar14) {
          uStack_70 = plain_text[uVar6 + 6];
          uVar5 = uStack_e8;
        }
        uStack_e8 = uVar5;
        uVar5 = plain_text[uVar6 + 7];
        if (bVar14) {
          uStack_68 = plain_text[uVar6 + 7];
          uVar5 = uStack_e0;
        }
        uStack_e0 = uVar5;
        uVar5 = plain_text[uVar6 + 8];
        if (bVar14) {
          uStack_60 = plain_text[uVar6 + 8];
          uVar5 = uStack_d8;
        }
        uStack_d8 = uVar5;
        uVar5 = plain_text[uVar6 + 9];
        if (bVar14) {
          uStack_58 = plain_text[uVar6 + 9];
          uVar5 = uStack_d0;
        }
        uStack_d0 = uVar5;
        uVar5 = plain_text[uVar6 + 10];
        if (bVar14) {
          uStack_50 = plain_text[uVar6 + 10];
          uVar5 = uStack_c8;
        }
        uStack_c8 = uVar5;
        uVar5 = plain_text[uVar6 + 0xb];
        if (bVar14) {
          uVar11 = plain_text[uVar6 + 0xb];
          uVar5 = uStack_c0;
        }
        uStack_c0 = uVar5;
        uVar5 = plain_text[uVar6 + 0xc];
        if (bVar14) {
          uVar10 = plain_text[uVar6 + 0xc];
          uVar5 = uStack_b8;
        }
        uStack_b8 = uVar5;
        uVar5 = plain_text[uVar6 + 0xd];
        if (bVar14) {
          uVar9 = plain_text[uVar6 + 0xd];
          uVar5 = uStack_b0;
        }
        uStack_b0 = uVar5;
        uVar5 = plain_text[uVar6 + 0xe];
        if (bVar14) {
          uVar8 = plain_text[uVar6 + 0xe];
          uVar5 = uStack_a8;
        }
        uStack_a8 = uVar5;
        uVar5 = plain_text[uVar6 + 0xf];
        if (bVar14) {
          uVar7 = plain_text[uVar6 + 0xf];
          uVar5 = uVar12;
        }
        uVar12 = uVar5;
        uVar5 = plain_text[uVar6];
        if (!bVar14) {
          uVar4 = plain_text[uVar6];
          uVar5 = uStack_a0;
        }
        uStack_a0 = uVar5;
        threefishDecryptBlockWords(key,puVar13,puVar13);
        if (uVar6 == 0) {
          *plain_text = *plain_text ^ *chain;
          plain_text[1] = plain_text[1] ^ chain[1];
          plain_text[2] = plain_text[2] ^ chain[2];
          plain_text[3] = plain_text[3] ^ chain[3];
          plain_text[4] = plain_text[4] ^ chain[4];
          plain_text[5] = plain_text[5] ^ chain[5];
          plain_text[6] = plain_text[6] ^ chain[6];
          plain_text[7] = plain_text[7] ^ chain[7];
          plain_text[8] = plain_text[8] ^ chain[8];
          plain_text[9] = plain_text[9] ^ chain[9];
          plain_text[10] = plain_text[10] ^ chain[10];
          plain_text[0xb] = plain_text[0xb] ^ chain[0xb];
          plain_text[0xc] = plain_text[0xc] ^ chain[0xc];
          plain_text[0xd] = plain_text[0xd] ^ chain[0xd];
          plain_text[0xe] = plain_text[0xe] ^ chain[0xe];
          uVar5 = chain[0xf];
          puVar2 = plain_text + 0xf;
        }
        else if ((uVar6 & 0x10) == 0) {
          puVar2 = plain_text + uVar6;
          *puVar2 = plain_text[uVar6] ^ uVar4;
          puVar2[1] = puVar2[1] ^ uStack_110;
          puVar2[2] = puVar2[2] ^ uStack_108;
          puVar2[3] = puVar2[3] ^ uStack_100;
          puVar2[4] = puVar2[4] ^ uStack_f8;
          puVar2[5] = puVar2[5] ^ uStack_f0;
          puVar2[6] = puVar2[6] ^ uStack_e8;
          puVar2[7] = puVar2[7] ^ uStack_e0;
          puVar2[8] = puVar2[8] ^ uStack_d8;
          puVar2[9] = puVar2[9] ^ uStack_d0;
          puVar2[10] = puVar2[10] ^ uStack_c8;
          puVar2[0xb] = puVar2[0xb] ^ uStack_c0;
          puVar2[0xc] = puVar2[0xc] ^ uStack_b8;
          puVar2[0xd] = puVar2[0xd] ^ uStack_b0;
          puVar2[0xe] = puVar2[0xe] ^ uStack_a8;
          puVar2 = puVar2 + 0xf;
          uVar5 = uVar12;
        }
        else {
          plain_text[uVar6] = plain_text[uVar6] ^ uStack_a0;
          plain_text[uVar6 + 1] = plain_text[uVar6 + 1] ^ uStack_98;
          plain_text[uVar6 + 2] = plain_text[uVar6 + 2] ^ uStack_90;
          plain_text[uVar6 + 3] = plain_text[uVar6 + 3] ^ uStack_88;
          plain_text[uVar6 + 4] = plain_text[uVar6 + 4] ^ uStack_80;
          plain_text[uVar6 + 5] = plain_text[uVar6 + 5] ^ uStack_78;
          plain_text[uVar6 + 6] = plain_text[uVar6 + 6] ^ uStack_70;
          plain_text[uVar6 + 7] = plain_text[uVar6 + 7] ^ uStack_68;
          plain_text[uVar6 + 8] = plain_text[uVar6 + 8] ^ uStack_60;
          plain_text[uVar6 + 9] = plain_text[uVar6 + 9] ^ uStack_58;
          plain_text[uVar6 + 10] = plain_text[uVar6 + 10] ^ uStack_50;
          plain_text[uVar6 + 0xb] = plain_text[uVar6 + 0xb] ^ uVar11;
          plain_text[uVar6 + 0xc] = plain_text[uVar6 + 0xc] ^ uVar10;
          plain_text[uVar6 + 0xd] = plain_text[uVar6 + 0xd] ^ uVar9;
          plain_text[uVar6 + 0xe] = plain_text[uVar6 + 0xe] ^ uVar8;
          puVar2 = puVar13 + 0xf;
          uVar5 = uVar7;
        }
        *puVar2 = *puVar2 ^ uVar5;
        uVar6 = uVar6 + 0x10;
        puVar13 = puVar13 + 0x10;
      } while (uVar6 < num_blocks << 4);
    }
    return;
  }
  if (uVar1 == 0x200) {
    if (num_blocks << 3 != 0) {
      uVar4 = 0;
      uVar5 = 0;
      uVar6 = 0;
      uVar7 = 0;
      uVar8 = 0;
      uVar9 = 0;
      uVar10 = 0;
      uVar11 = 0;
      uStack_50 = 0;
      uStack_58 = 0;
      uVar12 = 0;
      uStack_60 = 0;
      uStack_68 = 0;
      uStack_70 = 0;
      uStack_78 = 0;
      uStack_80 = 0;
      uStack_88 = 0;
      puVar13 = plain_text;
      do {
        bVar14 = (uVar5 & 8) == 0;
        uVar3 = plain_text[uVar5 + 1];
        if (bVar14) {
          uStack_50 = plain_text[uVar5 + 1];
          uVar3 = uStack_88;
        }
        uStack_88 = uVar3;
        uVar3 = plain_text[uVar5 + 2];
        if (bVar14) {
          uVar11 = plain_text[uVar5 + 2];
          uVar3 = uStack_80;
        }
        uStack_80 = uVar3;
        uVar3 = plain_text[uVar5 + 3];
        if (bVar14) {
          uVar10 = plain_text[uVar5 + 3];
          uVar3 = uStack_78;
        }
        uStack_78 = uVar3;
        uVar3 = plain_text[uVar5 + 4];
        if (bVar14) {
          uVar9 = plain_text[uVar5 + 4];
          uVar3 = uStack_70;
        }
        uStack_70 = uVar3;
        uVar3 = plain_text[uVar5 + 5];
        if (bVar14) {
          uVar8 = plain_text[uVar5 + 5];
          uVar3 = uStack_68;
        }
        uStack_68 = uVar3;
        uVar3 = plain_text[uVar5 + 6];
        if (bVar14) {
          uVar7 = plain_text[uVar5 + 6];
          uVar3 = uStack_60;
        }
        uStack_60 = uVar3;
        uVar3 = plain_text[uVar5 + 7];
        if (bVar14) {
          uVar6 = plain_text[uVar5 + 7];
          uVar3 = uVar12;
        }
        uVar12 = uVar3;
        uVar3 = plain_text[uVar5];
        if (!bVar14) {
          uVar4 = plain_text[uVar5];
          uVar3 = uStack_58;
        }
        uStack_58 = uVar3;
        threefishDecryptBlockWords(key,puVar13,puVar13);
        if (uVar5 == 0) {
          *plain_text = *plain_text ^ *chain;
          plain_text[1] = plain_text[1] ^ chain[1];
          plain_text[2] = plain_text[2] ^ chain[2];
          plain_text[3] = plain_text[3] ^ chain[3];
          plain_text[4] = plain_text[4] ^ chain[4];
          plain_text[5] = plain_text[5] ^ chain[5];
          plain_text[6] = plain_text[6] ^ chain[6];
          uVar3 = chain[7];
          puVar2 = plain_text + 7;
        }
        else {
          puVar2 = puVar13 + 7;
          if ((uVar5 & 8) == 0) {
            plain_text[uVar5] = plain_text[uVar5] ^ uVar4;
            plain_text[uVar5 + 1] = plain_text[uVar5 + 1] ^ uStack_88;
            plain_text[uVar5 + 2] = plain_text[uVar5 + 2] ^ uStack_80;
            plain_text[uVar5 + 3] = plain_text[uVar5 + 3] ^ uStack_78;
            plain_text[uVar5 + 4] = plain_text[uVar5 + 4] ^ uStack_70;
            plain_text[uVar5 + 5] = plain_text[uVar5 + 5] ^ uStack_68;
            plain_text[uVar5 + 6] = plain_text[uVar5 + 6] ^ uStack_60;
            uVar3 = uVar12;
          }
          else {
            plain_text[uVar5] = plain_text[uVar5] ^ uStack_58;
            plain_text[uVar5 + 1] = plain_text[uVar5 + 1] ^ uStack_50;
            plain_text[uVar5 + 2] = plain_text[uVar5 + 2] ^ uVar11;
            plain_text[uVar5 + 3] = plain_text[uVar5 + 3] ^ uVar10;
            plain_text[uVar5 + 4] = plain_text[uVar5 + 4] ^ uVar9;
            plain_text[uVar5 + 5] = plain_text[uVar5 + 5] ^ uVar8;
            plain_text[uVar5 + 6] = plain_text[uVar5 + 6] ^ uVar7;
            uVar3 = uVar6;
          }
        }
        *puVar2 = *puVar2 ^ uVar3;
        uVar5 = uVar5 + 8;
        puVar13 = puVar13 + 8;
      } while (uVar5 < num_blocks << 3);
    }
    return;
  }
  if (uVar1 == 0x100) {
    cbc256Decrypt(key,chain,plain_text,num_blocks);
    return;
  }
  decryptInPlace_cold_1();
  *extraout_RDX = *extraout_RDX ^ *chain;
  extraout_RDX[1] = extraout_RDX[1] ^ chain[1];
  extraout_RDX[2] = extraout_RDX[2] ^ chain[2];
  extraout_RDX[3] = extraout_RDX[3] ^ chain[3];
  if (num_blocks << 2 != 0) {
    uVar12 = 0;
    puVar2 = extraout_RDX;
    do {
      if (uVar12 != 0) {
        *puVar2 = *puVar2 ^ puVar2[-4];
        puVar2[1] = puVar2[1] ^ puVar2[-3];
        puVar2[2] = puVar2[2] ^ puVar2[-2];
        puVar2[3] = puVar2[3] ^ puVar2[-1];
      }
      threefishEncryptBlockWords(key,puVar2,puVar2);
      uVar12 = uVar12 + 4;
      puVar2 = puVar2 + 4;
    } while (uVar12 < num_blocks << 2);
  }
  return;
}

Assistant:

void decryptInPlace(ThreefishKey_t* key,
                    const uint64_t* chain,
                    uint64_t* plain_text,
                    const uint64_t num_blocks)
{
    pd2("decryptInPlace(key:%lu, chain:%lu, plain_text:%lu, num_blocks:%lu)\n",
        key->key[0],
        chain[0],
        plain_text[0],
        num_blocks);

    switch(key->stateSize) //call the corresponding cbc Encrypt function
    {
        case 256: cbc256Decrypt(key, chain, plain_text, num_blocks);
        break;
        case 512: cbc512Decrypt(key, chain, plain_text, num_blocks);
        break;
        case 1024: cbc1024Decrypt(key, chain, plain_text, num_blocks);
        break;
        default:
        {
            perror("Invalid state size cannot continue\n");
            exit(9);
        }
        break;
    }
}